

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageSamplingInstance.cpp
# Opt level: O0

MovePtr<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> *
vkt::pipeline::anon_unknown_0::createSwizzledCopy<tcu::Texture1DView>
          (MovePtr<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> *__return_storage_ptr__,
          Texture1DView *texture,VkComponentMapping *swz)

{
  int iVar1;
  ConstPixelBufferAccess *pCVar2;
  TextureFormat *pTVar3;
  Texture1D *pTVar4;
  PixelBufferAccess *dst;
  int local_3c;
  DefaultDeleter<tcu::Texture1D> local_35;
  int levelNdx;
  TextureFormat local_2c;
  undefined1 local_21;
  VkComponentMapping *local_20;
  VkComponentMapping *swz_local;
  Texture1DView *texture_local;
  MovePtr<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> *copy;
  
  local_21 = 0;
  local_20 = swz;
  swz_local = (VkComponentMapping *)texture;
  texture_local = (Texture1DView *)__return_storage_ptr__;
  pCVar2 = tcu::Texture1DView::getLevel(texture,0);
  pTVar3 = tcu::ConstPixelBufferAccess::getFormat(pCVar2);
  _levelNdx = *pTVar3;
  local_2c = getSwizzleTargetFormat(_levelNdx);
  pCVar2 = tcu::Texture1DView::getLevel((Texture1DView *)swz_local,0);
  pTVar4 = createSkeletonClone<tcu::Texture1DView>(local_2c,pCVar2);
  de::DefaultDeleter<tcu::Texture1D>::DefaultDeleter(&local_35);
  de::details::MovePtr<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>::MovePtr
            (__return_storage_ptr__,pTVar4);
  for (local_3c = 0; iVar1 = tcu::Texture1DView::getNumLevels((Texture1DView *)swz_local),
      local_3c < iVar1; local_3c = local_3c + 1) {
    pTVar4 = de::details::UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>::
             operator->(&__return_storage_ptr__->
                         super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>);
    tcu::Texture1D::allocLevel(pTVar4,local_3c);
    pCVar2 = tcu::Texture1DView::getLevel((Texture1DView *)swz_local,local_3c);
    pTVar4 = de::details::UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>::
             operator->(&__return_storage_ptr__->
                         super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>);
    dst = tcu::TextureLevelPyramid::getLevel(&pTVar4->super_TextureLevelPyramid,local_3c);
    swizzle(pCVar2,dst,local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

MovePtr<typename TexViewTraits<TextureViewType>::TextureType> createSwizzledCopy (const TextureViewType& texture, const vk::VkComponentMapping& swz)
{
	MovePtr<typename TexViewTraits<TextureViewType>::TextureType>	copy	(createSkeletonClone<TextureViewType>(getSwizzleTargetFormat(texture.getLevel(0).getFormat()), texture.getLevel(0)));

	for (int levelNdx = 0; levelNdx < texture.getNumLevels(); ++levelNdx)
	{
		copy->allocLevel(levelNdx);
		swizzle(texture.getLevel(levelNdx), copy->getLevel(levelNdx), swz);
	}

	return copy;
}